

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O2

void __thiscall QPushButton::mouseMoveEvent(QPushButton *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  long in_FS_OFFSET;
  QRect local_40;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  bVar2 = QWidget::testAttribute_helper((QWidget *)this,WA_Hover);
  if (bVar2) {
    cVar3 = '\0';
    if ((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 2) != 0) {
      local_40 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)e);
      local_30 = QPointF::toPoint((QPointF *)&local_40);
      cVar3 = (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1a0))(this);
    }
    if ((bool)cVar3 != ((*(uint *)(lVar1 + 0x2c8) >> 5 & 1) != 0)) {
      local_40 = QWidget::rect((QWidget *)this);
      QWidget::update((QWidget *)this,&local_40);
      *(byte *)(lVar1 + 0x2c8) = *(byte *)(lVar1 + 0x2c8) & 0xdf | cVar3 << 5;
    }
  }
  QAbstractButton::mouseMoveEvent(&this->super_QAbstractButton,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPushButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QPushButton);

    if (testAttribute(Qt::WA_Hover)) {
        bool hit = false;
        if (underMouse())
            hit = hitButton(e->position().toPoint());

        if (hit != d->hovering) {
            update(rect());
            d->hovering = hit;
        }
    }

    QAbstractButton::mouseMoveEvent(e);
}